

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
::eraseImpl(Table<kj::HashMap<kj::String,_int>::Entry,_kj::HashIndex<kj::HashMap<kj::String,_int>::Callbacks>_>
            *this,size_t pos)

{
  StringPtr *pSVar1;
  size_t sVar2;
  Entry *this_00;
  size_t back;
  size_t pos_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  pSVar1 = Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                     ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this,pos);
  Impl<0UL,_false>::erase
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             this,pos,pSVar1);
  sVar2 = Vector<kj::HashMap<kj::String,_int>::Entry>::size
                    ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this);
  sVar2 = sVar2 - 1;
  if (pos != sVar2) {
    pSVar1 = Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                       ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this,sVar2);
    Impl<0UL,_false>::move
              ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
               this,sVar2,pos,pSVar1);
    pSVar1 = Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                       ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this,sVar2);
    pSVar1 = mv<kj::HashMap<kj::String,int>::Entry>(pSVar1);
    this_00 = (Entry *)Vector<kj::HashMap<kj::String,_int>::Entry>::operator[]
                                 ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this,pos);
    HashMap<kj::String,_int>::Entry::operator=(this_00,pSVar1);
  }
  Vector<kj::HashMap<kj::String,_int>::Entry>::removeLast
            ((Vector<kj::HashMap<kj::String,_int>::Entry> *)this);
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}